

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O2

bool __thiscall
FIX::SocketAcceptor::onData(SocketAcceptor *this,SocketServer *server,socket_handle s)

{
  _Rb_tree_header *__nbytes;
  undefined1 uVar1;
  iterator iVar2;
  key_type local_14;
  ssize_t sVar3;
  
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_FIX::SocketConnection_*>,_std::_Select1st<std::pair<const_int,_FIX::SocketConnection_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
          ::find(&(this->m_connections)._M_t,&local_14);
  __nbytes = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == __nbytes) {
    uVar1 = 0;
  }
  else {
    sVar3 = SocketConnection::read
                      ((SocketConnection *)iVar2._M_node[1]._M_parent,(int)this,server,
                       (size_t)__nbytes);
    uVar1 = (undefined1)sVar3;
  }
  return (bool)uVar1;
}

Assistant:

bool SocketAcceptor::onData(SocketServer &server, socket_handle s) {
  SocketConnections::iterator i = m_connections.find(s);
  if (i == m_connections.end()) {
    return false;
  }
  SocketConnection *pSocketConnection = i->second;
  return pSocketConnection->read(*this, server);
}